

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.cc
# Opt level: O3

void tvm::contrib::topk<double,long>
               (DLTensor *input,DLTensor *out_values,DLTensor *out_indices,int k,int axis,
               bool is_ascend)

{
  __normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
  __first;
  iterator __last;
  uint uVar1;
  ulong uVar2;
  long lVar3;
  void *pvVar4;
  void *pvVar5;
  undefined3 in_register_00000089;
  long lVar6;
  void *pvVar7;
  long lVar8;
  void *pvVar9;
  double *pdVar10;
  vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> sorter;
  uint local_e0;
  uint local_dc;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::pair<long,_double>_>
  local_c0;
  __normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
  local_a8;
  iterator iStack_a0;
  pair<long,_double> *local_98;
  ulong local_90;
  int local_88;
  undefined4 local_84;
  long local_80;
  void *local_78;
  void *local_70;
  void *local_68;
  void *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_84 = CONCAT31(in_register_00000089,is_ascend);
  if (out_values == (DLTensor *)0x0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = out_values->data;
  }
  if (out_indices == (DLTensor *)0x0) {
    pvVar9 = (void *)0x0;
  }
  else {
    pvVar9 = out_indices->data;
  }
  local_60 = input->data;
  local_a8._M_current = (pair<long,_double> *)0x0;
  iStack_a0._M_current = (pair<long,_double> *)0x0;
  local_98 = (pair<long,_double> *)0x0;
  lVar6 = (long)axis;
  if ((long)input->ndim < 1) {
    local_e0 = 1;
    uVar1 = 1;
  }
  else {
    uVar1 = 1;
    lVar3 = 0;
    local_e0 = 1;
    do {
      if (lVar3 < lVar6) {
        uVar1 = uVar1 * (int)input->shape[lVar3];
      }
      else if (lVar6 < lVar3) {
        local_e0 = local_e0 * (int)input->shape[lVar3];
      }
      lVar3 = lVar3 + 1;
    } while (input->ndim != lVar3);
  }
  local_dc = k;
  if (k < 1) {
    local_dc = *(uint *)(input->shape + lVar6);
  }
  if (0 < (int)uVar1) {
    local_40 = (ulong)local_dc;
    local_58 = (ulong)uVar1;
    local_48 = (ulong)local_e0;
    lVar3 = (long)(int)local_e0 * 8;
    local_88 = local_dc * local_e0;
    local_90 = 0;
    local_80 = 0;
    uVar2 = 0;
    local_78 = pvVar9;
    local_70 = pvVar7;
    do {
      local_50 = uVar2;
      if (0 < (int)local_e0) {
        pvVar4 = (void *)((long)pvVar7 + (long)(int)local_90 * 8);
        pvVar5 = (void *)((long)pvVar9 + (long)(int)local_90 * 8);
        local_68 = local_60;
        uVar2 = 0;
        do {
          if (iStack_a0._M_current != local_a8._M_current) {
            iStack_a0._M_current = local_a8._M_current;
          }
          local_38 = uVar2;
          if (0 < input->shape[lVar6]) {
            pdVar10 = (double *)(input->shape[lVar6] * local_80 + (long)local_68);
            lVar8 = 0;
            do {
              local_c0._M_len = (size_type_conflict)*pdVar10;
              local_c0._M_original_len = lVar8;
              if (iStack_a0._M_current == local_98) {
                std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>::
                _M_realloc_insert<std::pair<long,double>>
                          ((vector<std::pair<long,double>,std::allocator<std::pair<long,double>>> *)
                           &local_a8,iStack_a0,(pair<long,_double> *)&local_c0);
              }
              else {
                (iStack_a0._M_current)->first = lVar8;
                (iStack_a0._M_current)->second = (double)local_c0._M_len;
                iStack_a0._M_current = iStack_a0._M_current + 1;
              }
              lVar8 = lVar8 + 1;
              pdVar10 = pdVar10 + (int)local_e0;
            } while (lVar8 < input->shape[lVar6]);
          }
          pvVar7 = local_70;
          pvVar9 = local_78;
          __last._M_current = iStack_a0._M_current;
          __first._M_current = local_a8._M_current;
          if ((char)local_84 == '\0') {
            if (local_a8._M_current != iStack_a0._M_current) {
              lVar8 = (long)iStack_a0._M_current - (long)local_a8._M_current >> 4;
              std::
              _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::pair<long,_double>_>
              ::_Temporary_buffer(&local_c0,local_a8,(lVar8 - (lVar8 + 1 >> 0x3f)) + 1 >> 1);
              if (local_c0._M_buffer == (pair<long,_double> *)0x0) {
                std::
                __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<long,double>*,std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<long,double>const&,std::pair<long,double>const&)>>
                          (__first,(__normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
                                    )__last._M_current,
                           (_Iter_comp_iter<bool_(*)(const_std::pair<long,_double>_&,_const_std::pair<long,_double>_&)>
                            )0x12d8bd);
              }
              else {
                std::
                __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<long,double>*,std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>,std::pair<long,double>*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<long,double>const&,std::pair<long,double>const&)>>
                          (__first,(__normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
                                    )__last._M_current,local_c0._M_buffer,local_c0._M_len,
                           (_Iter_comp_iter<bool_(*)(const_std::pair<long,_double>_&,_const_std::pair<long,_double>_&)>
                            )0x12d8bd);
              }
              goto LAB_0013263c;
            }
          }
          else if (local_a8._M_current != iStack_a0._M_current) {
            lVar8 = (long)iStack_a0._M_current - (long)local_a8._M_current >> 4;
            std::
            _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::pair<long,_double>_>
            ::_Temporary_buffer(&local_c0,local_a8,(lVar8 - (lVar8 + 1 >> 0x3f)) + 1 >> 1);
            if (local_c0._M_buffer == (pair<long,_double> *)0x0) {
              std::
              __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<long,double>*,std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<long,double>const&,std::pair<long,double>const&)>>
                        (__first,(__normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
                                  )__last._M_current,
                         (_Iter_comp_iter<bool_(*)(const_std::pair<long,_double>_&,_const_std::pair<long,_double>_&)>
                          )0x12d8af);
            }
            else {
              std::
              __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<long,double>*,std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>,std::pair<long,double>*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<long,double>const&,std::pair<long,double>const&)>>
                        (__first,(__normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
                                  )__last._M_current,local_c0._M_buffer,local_c0._M_len,
                         (_Iter_comp_iter<bool_(*)(const_std::pair<long,_double>_&,_const_std::pair<long,_double>_&)>
                          )0x12d8af);
            }
LAB_0013263c:
            operator_delete(local_c0._M_buffer,local_c0._M_len << 4);
          }
          uVar2 = local_40;
          if ((int)local_dc < 1) {
            uVar2 = input->shape[lVar6];
          }
          if (0 < (long)uVar2) {
            pdVar10 = &(local_a8._M_current)->second;
            lVar8 = 0;
            do {
              if (pvVar9 != (void *)0x0) {
                *(long *)((long)pvVar5 + lVar8) = ((pair<long,_double> *)(pdVar10 + -1))->first;
              }
              if (pvVar7 != (void *)0x0) {
                *(double *)((long)pvVar4 + lVar8) = *pdVar10;
              }
              lVar8 = lVar8 + lVar3;
              pdVar10 = pdVar10 + 2;
              uVar2 = uVar2 - 1;
            } while (uVar2 != 0);
          }
          uVar2 = local_38 + 1;
          local_68 = (void *)((long)local_68 + 8);
          pvVar4 = (void *)((long)pvVar4 + 8);
          pvVar5 = (void *)((long)pvVar5 + 8);
        } while (uVar2 != local_48);
      }
      uVar2 = local_50 + 1;
      local_80 = local_80 + lVar3;
      local_90 = (ulong)(uint)((int)local_90 + local_88);
    } while (uVar2 != local_58);
    if (local_a8._M_current != (pair<long,_double> *)0x0) {
      operator_delete(local_a8._M_current,(long)local_98 - (long)local_a8._M_current);
    }
  }
  return;
}

Assistant:

void topk(DLTensor *input,
          DLTensor *out_values,
          DLTensor *out_indices,
          int k,
          int axis,
          bool is_ascend) {
  DataType *data_ptr = static_cast<DataType *>(input->data);
  DataType *values_ptr = (out_values == nullptr) ? nullptr : static_cast<DataType *>(out_values->data);
  IndicesType *indices_ptr = (out_indices == nullptr) ? nullptr : static_cast<IndicesType *>(out_indices->data);
  std::vector<std::pair<int64_t, DataType>> sorter;

  int axis_mul_before = 1;
  int axis_mul_after = 1;
  for (int i = 0; i < input->ndim; ++i) {
    if (i < axis) {
      axis_mul_before *= input->shape[i];
    } else if (i > axis) {
      axis_mul_after *= input->shape[i];
    }
  }
  if (k < 1) {
    k = input->shape[axis];
  }

  for (int i = 0; i < axis_mul_before; ++i) {
    for (int j = 0; j < axis_mul_after; ++j) {
      sorter.clear();
      int64_t src_base_idx = i * input->shape[axis] * axis_mul_after + j;
      int64_t dst_base_idx = i * k * axis_mul_after + j;
      for (int64_t kk = 0; kk < input->shape[axis]; ++kk) {
        int64_t full_idx = src_base_idx + kk * axis_mul_after;
        sorter.emplace_back(std::make_pair(kk, data_ptr[full_idx]));
      }
      if (is_ascend) {
        std::stable_sort(sorter.begin(), sorter.end(), CompareAscend<DataType>);
      } else {
        std::stable_sort(sorter.begin(), sorter.end(), CompareDescend<DataType>);
      }
      int64_t cnt = k > 0 ? k : input->shape[axis];
      for (int64_t kk = 0; kk < cnt; ++kk) {
        if (indices_ptr != nullptr) {
          indices_ptr[dst_base_idx + kk * axis_mul_after] =
              static_cast<IndicesType>(sorter[kk].first);
        }
        if (values_ptr != nullptr) {
          values_ptr[dst_base_idx + kk * axis_mul_after] =
              static_cast<DataType>(sorter[kk].second);
        }
      }
    }
  }
}